

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CAssignSubscriptStm *stm)

{
  initializer_list<INode_*> __l;
  allocator local_d9;
  string local_d8 [32];
  vector<INode_*,_std::allocator<INode_*>_> local_b8;
  ChildrenAnswers local_a0;
  allocator<INode_*> local_59;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CAssignSubscriptStm *stm_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)stm;
  local_58 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::get(&stm->idExpression);
  local_50 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get
                       ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  local_48 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get
                       ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 5));
  local_40 = &local_58;
  local_38 = 3;
  std::allocator<INode_*>::allocator(&local_59);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_59);
  std::allocator<INode_*>::~allocator(&local_59);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_b8,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren(&local_a0,this,&local_b8);
  AddChildrenAnswers(this,&local_a0);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&local_a0);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"AssignSubscriptStm",&local_d9);
  AddLabel(this,(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  this->lastVisited = this->lastVisited + 1;
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CAssignSubscriptStm &stm) {
	std::vector<INode*> children = { stm.idExpression.get(), stm.indexExpression.get(), stm.valueExpression.get() };
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("AssignSubscriptStm");
	++lastVisited;
}